

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Semaphore.cpp
# Opt level: O0

void __thiscall
myvk::SemaphoreStageGroup::Initialize
          (SemaphoreStageGroup *this,
          vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
          *stage_semaphores)

{
  bool bVar1;
  reference this_00;
  element_type *this_01;
  VkSemaphore __x;
  undefined8 in_RSI;
  vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_> *in_RDI;
  pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int> *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
  *__range1;
  vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_*,_std::vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>_>
  local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::clear
            ((vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_> *)0x2cbb0d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2cbb1b);
  local_18 = local_10;
  local_20._M_current =
       (pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int> *)
       std::
       vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
       ::begin(in_stack_ffffffffffffffb8);
  std::
  vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>
  ::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_*,_std::vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>_>
                      ((__normal_iterator<const_std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_*,_std::vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_*,_std::vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_*,_std::vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>_>
              ::operator*(&local_20);
    this_01 = std::__shared_ptr_access<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Semaphore,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2cbb73);
    __x = Semaphore::GetHandle(this_01);
    std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
              (in_RDI,(value_type *)in_stack_ffffffffffffffb8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
               (value_type_conflict2 *)__x);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_*,_std::vector<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>,_std::allocator<std::pair<std::shared_ptr<myvk::Semaphore>,_unsigned_int>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void SemaphoreStageGroup::Initialize(
    const std::vector<std::pair<Ptr<Semaphore>, VkPipelineStageFlags>> &stage_semaphores) {
	m_semaphores.clear();
	m_stages.clear();
	for (const auto &i : stage_semaphores) {
		m_semaphores.push_back(i.first->GetHandle());
		m_stages.push_back(i.second);
	}
}